

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>_>::
disposeImpl(HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>_>
            *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::Directory>_>
  *this_local;
  
  if (pointer != (void *)0x0) {
    anon_unknown_35::InMemoryDirectory::BrokenReplacer<kj::Directory>::~BrokenReplacer
              ((BrokenReplacer<kj::Directory> *)pointer);
    operator_delete(pointer,0x20);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }